

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOCC-CTA-cs16btech11038.cpp
# Opt level: O0

char __thiscall BOCC_CTA::tryC(BOCC_CTA *this,int tid)

{
  int iVar1;
  value_type vVar2;
  mapped_type pTVar3;
  Transaction *this_00;
  value_type pDVar4;
  bool bVar5;
  char cVar6;
  mapped_type *ppTVar7;
  reference ppTVar8;
  rep rVar9;
  reference piVar10;
  reference ppDVar11;
  reference pvVar12;
  iterator iStack_100;
  int e_2;
  iterator __end2_2;
  iterator __begin2_2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2_2;
  iterator iStack_d8;
  int e_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2_1;
  Transaction *g;
  iterator __end2;
  iterator __begin2;
  set<Transaction_*,_TransCompare,_std::allocator<Transaction_*>_> *__range2;
  iterator iStack_80;
  int e;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  undefined1 auStack_58 [8];
  set<int,_std::less<int>,_std::allocator<int>_> conf_trans;
  int local_1c;
  BOCC_CTA *pBStack_18;
  int tid_local;
  BOCC_CTA *this_local;
  
  conf_trans._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  conf_trans._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  conf_trans._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  conf_trans._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  conf_trans._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  auStack_58 = (undefined1  [8])0x0;
  conf_trans._M_t._M_impl._0_8_ = 0;
  local_1c = tid;
  pBStack_18 = this;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)auStack_58);
  std::shared_mutex::lock_shared(&this->scheduler_lock);
  ppTVar7 = std::
            unordered_map<int,_Transaction_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
            ::operator[](&this->transactions,&local_1c);
  pTVar3 = *ppTVar7;
  __end1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&pTVar3->readSet);
  iStack_80 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(&pTVar3->readSet);
  while (bVar5 = std::operator!=(&__end1,&stack0xffffffffffffff80), bVar5) {
    piVar10 = std::_Rb_tree_const_iterator<int>::operator*(&__end1);
    iVar1 = *piVar10;
    ppDVar11 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                         (&this->dataItems,(long)iVar1);
    std::mutex::lock(&(*ppDVar11)->lock);
    ppDVar11 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                         (&this->dataItems,(long)iVar1);
    pDVar4 = *ppDVar11;
    __end2 = std::set<Transaction_*,_TransCompare,_std::allocator<Transaction_*>_>::begin
                       (&pDVar4->read_list);
    g = (Transaction *)
        std::set<Transaction_*,_TransCompare,_std::allocator<Transaction_*>_>::end
                  (&pDVar4->read_list);
    while (bVar5 = std::operator!=(&__end2,(_Self *)&g), bVar5) {
      ppTVar8 = std::_Rb_tree_const_iterator<Transaction_*>::operator*(&__end2);
      this_00 = *ppTVar8;
      cVar6 = Transaction::getStatus(this_00);
      if (cVar6 == 'c') {
        ppTVar7 = std::
                  unordered_map<int,_Transaction_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
                  ::operator[](&this->transactions,&local_1c);
        bVar5 = std::chrono::operator<(&(*ppTVar7)->start_time,&this_00->end_time);
        if (bVar5) {
          std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)auStack_58,&this_00->id);
        }
      }
      std::_Rb_tree_const_iterator<Transaction_*>::operator++(&__end2);
    }
    std::_Rb_tree_const_iterator<int>::operator++(&__end1);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::erase
            ((set<int,_std::less<int>,_std::allocator<int>_> *)auStack_58,&local_1c);
  bVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)auStack_58);
  if (bVar5) {
    ppTVar7 = std::
              unordered_map<int,_Transaction_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
              ::operator[](&this->transactions,&local_1c);
    Transaction::setStatus(*ppTVar7,'c');
    rVar9 = std::chrono::_V2::system_clock::now();
    ppTVar7 = std::
              unordered_map<int,_Transaction_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
              ::operator[](&this->transactions,&local_1c);
    ((*ppTVar7)->end_time).__d.__r = rVar9;
    ppTVar7 = std::
              unordered_map<int,_Transaction_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
              ::operator[](&this->transactions,&local_1c);
    pTVar3 = *ppTVar7;
    __end2_2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&pTVar3->writeSet);
    iStack_100 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(&pTVar3->writeSet);
    while (bVar5 = std::operator!=(&__end2_2,&stack0xffffffffffffff00), bVar5) {
      piVar10 = std::_Rb_tree_const_iterator<int>::operator*(&__end2_2);
      iVar1 = *piVar10;
      ppTVar7 = std::
                unordered_map<int,_Transaction_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
                ::operator[](&this->transactions,&local_1c);
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&(*ppTVar7)->local_write_store,(long)iVar1);
      vVar2 = *pvVar12;
      ppDVar11 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                           (&this->dataItems,(long)iVar1);
      (*ppDVar11)->value = vVar2;
      ppDVar11 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                           (&this->dataItems,(long)iVar1);
      std::mutex::unlock(&(*ppDVar11)->lock);
      std::_Rb_tree_const_iterator<int>::operator++(&__end2_2);
    }
    std::shared_mutex::unlock_shared(&this->scheduler_lock);
    this_local._7_1_ = 'c';
  }
  else {
    ppTVar7 = std::
              unordered_map<int,_Transaction_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
              ::operator[](&this->transactions,&local_1c);
    Transaction::setStatus(*ppTVar7,'a');
    rVar9 = std::chrono::_V2::system_clock::now();
    ppTVar7 = std::
              unordered_map<int,_Transaction_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
              ::operator[](&this->transactions,&local_1c);
    ((*ppTVar7)->end_time).__d.__r = rVar9;
    ppTVar7 = std::
              unordered_map<int,_Transaction_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
              ::operator[](&this->transactions,&local_1c);
    pTVar3 = *ppTVar7;
    __end2_1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&pTVar3->readSet);
    iStack_d8 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(&pTVar3->readSet);
    while (bVar5 = std::operator!=(&__end2_1,&stack0xffffffffffffff28), bVar5) {
      piVar10 = std::_Rb_tree_const_iterator<int>::operator*(&__end2_1);
      iVar1 = *piVar10;
      ppDVar11 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                           (&this->dataItems,(long)iVar1);
      pDVar4 = *ppDVar11;
      ppTVar7 = std::
                unordered_map<int,_Transaction_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
                ::operator[](&this->transactions,&local_1c);
      std::set<Transaction_*,_TransCompare,_std::allocator<Transaction_*>_>::erase
                (&pDVar4->read_list,ppTVar7);
      ppDVar11 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                           (&this->dataItems,(long)iVar1);
      std::mutex::unlock(&(*ppDVar11)->lock);
      std::_Rb_tree_const_iterator<int>::operator++(&__end2_1);
    }
    std::shared_mutex::unlock_shared(&this->scheduler_lock);
    this_local._7_1_ = 'a';
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)auStack_58);
  return this_local._7_1_;
}

Assistant:

char BOCC_CTA::tryC(const int tid) {
    std::set<int> conf_trans{};

    scheduler_lock.lock_shared();

    // lock all the data items, get conflicting transactions.
    for(auto e: transactions[tid]->readSet){
        // lock each data item.
        dataItems[e]->lock.lock();


        // todo: Might (or might not) need a lock on these transactions' status, if each transaction doesnt
        //  read AND write each data item it accesses (since multiple transactions can be in try commit at
        //  the same time - fine grained locking!
        //  Solution: Lock all items in the current transaction's writeSet along with those in readSet!
        // todo: Possibility of these transactions (in the readList) being deleted?
        // Seems to be 0, becauase we have acquired a shared_lock on the scheduler.
        // add all the conflicting and still running transactions here, they will be aborted.
        for(auto g: dataItems[e]->read_list){
            if(g->getStatus()=='c' && (transactions[tid]->start_time < g->end_time)) conf_trans.insert(g->id);
        }
    }
    conf_trans.erase(tid);
    // abort this transaction if conflicting transactions are present!
    if(!conf_trans.empty()){
        transactions[tid]->setStatus('a');
        transactions[tid]->end_time = std::chrono::high_resolution_clock::now();
        for(auto e: transactions[tid]->readSet){
            dataItems[e]->read_list.erase(transactions[tid]);
            dataItems[e]->lock.unlock();
        }
        scheduler_lock.unlock_shared();
        return 'a';
    }
    else{
        transactions[tid]->setStatus('c');
        transactions[tid]->end_time = std::chrono::high_resolution_clock::now();
        for(auto e: transactions[tid]->writeSet){
            dataItems[e]->value = transactions[tid]->local_write_store[e];
            dataItems[e]->lock.unlock();
        }
        scheduler_lock.unlock_shared();
        return 'c';

    }
}